

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

Node * __thiscall anon_unknown.dwarf_543c74::Db::parseUnresolvedType(Db *this)

{
  char cVar1;
  Node *pNVar2;
  Node *TP;
  Node *local_18;
  
  if (this->Last != this->First) {
    cVar1 = *this->First;
    if (cVar1 == 'D') {
      pNVar2 = parseDecltype(this);
    }
    else {
      if (cVar1 != 'T') goto LAB_001b7365;
      pNVar2 = parseTemplateParam(this);
    }
    if (pNVar2 != (Node *)0x0) {
      local_18 = pNVar2;
      PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Subs,&local_18);
    }
    return pNVar2;
  }
LAB_001b7365:
  pNVar2 = parseSubstitution(this);
  return pNVar2;
}

Assistant:

Node *Db::parseUnresolvedType() {
  if (look() == 'T') {
    Node *TP = parseTemplateParam();
    if (TP == nullptr)
      return nullptr;
    Subs.push_back(TP);
    return TP;
  }
  if (look() == 'D') {
    Node *DT = parseDecltype();
    if (DT == nullptr)
      return nullptr;
    Subs.push_back(DT);
    return DT;
  }
  return parseSubstitution();
}